

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O3

void __thiscall
t_ocaml_generator::generate_serialize_field
          (t_ocaml_generator *this,ostream *out,t_field *tfield,string *name)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  t_type *ttype;
  ostream *poVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  t_struct *tstruct;
  long lVar6;
  char *pcVar7;
  _Alloc_hider _Var8;
  t_base_type *this_00;
  undefined1 auVar9 [12];
  string ename;
  string local_e0;
  t_ocaml_generator *local_c0;
  ostream *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  string local_50;
  
  ttype = t_type::get_true_type(tfield->type_);
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
  if ((char)iVar3 != '\0') {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(pbVar5,"CANNOT GENERATE SERIALIZE CODE FOR void TYPE: ",&tfield->name_);
    __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  if (name->_M_string_length == 0) {
    pcVar1 = (tfield->name_)._M_dataplus._M_p;
    local_c0 = this;
    local_b8 = out;
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar1,pcVar1 + (tfield->name_)._M_string_length);
    paVar2 = local_b0;
    iVar3 = tolower((int)local_b0->_M_local_buf[0]);
    paVar2->_M_local_buf[0] = (char)iVar3;
    if (local_b0 == &local_a0) {
      local_e0.field_2._8_8_ = local_a0._8_8_;
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    }
    else {
      local_e0._M_dataplus._M_p = (pointer)local_b0;
    }
    local_e0._M_string_length = local_a8;
    local_a8 = 0;
    local_a0._M_local_buf[0] = '\0';
    local_b0 = &local_a0;
    std::__cxx11::string::operator=((string *)name,(string *)&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    out = local_b8;
    this = local_c0;
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
      this = local_c0;
    }
  }
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
  if (((char)iVar3 != '\0') ||
     (iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype), (char)iVar3 != '\0')) {
    pcVar1 = (name->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
    generate_serialize_struct(this,out,tstruct,&local_50);
    _Var8._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_002df6db;
LAB_002df6d6:
    operator_delete(_Var8._M_p);
    goto LAB_002df6db;
  }
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
  if ((char)iVar3 != '\0') {
    pcVar1 = (name->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + name->_M_string_length);
    generate_serialize_container(this,out,ttype,&local_70);
    _Var8._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_002df6db;
    goto LAB_002df6d6;
  }
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
  if (((char)iVar3 == '\0') &&
     (iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype), (char)iVar3 == '\0')) {
    pcVar1 = (tfield->name_)._M_dataplus._M_p;
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
    printf("DO NOT KNOW HOW TO SERIALIZE FIELD \'%s\' TYPE \'%s\'\n",pcVar1,
           *(undefined8 *)CONCAT44(extraout_var_00,iVar3));
    goto LAB_002df6db;
  }
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"oprot#",6);
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
  if ((char)iVar3 == '\0') {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
    if ((char)iVar3 == '\0') goto LAB_002df6db;
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
    lVar6 = *(long *)CONCAT44(extraout_var,iVar3);
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,lVar6,((long *)CONCAT44(extraout_var,iVar3))[1] + lVar6);
    paVar2 = local_90;
    iVar3 = toupper((int)local_90->_M_local_buf[0]);
    paVar2->_M_local_buf[0] = (char)iVar3;
    if (local_90 == &local_80) {
      local_e0.field_2._8_8_ = local_80._8_8_;
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    }
    else {
      local_e0._M_dataplus._M_p = (pointer)local_90;
    }
    local_e0._M_string_length = local_88;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_90 = &local_80;
    std::__ostream_insert<char,std::char_traits<char>>(out,"writeI32(",9);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_e0._M_dataplus._M_p,local_e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,".to_i ",6);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
    _Var8._M_p = local_e0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p == &local_e0.field_2) goto LAB_002df6db;
    goto LAB_002df6d6;
  }
  this_00 = (t_base_type *)(ulong)*(uint *)&ttype[1].super_t_doc._vptr_t_doc;
  switch(this_00) {
  case (t_base_type *)0x0:
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(pbVar5,"compiler error: cannot serialize void field in a struct: ",name);
    __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  case (t_base_type *)0x1:
    pcVar7 = "out.writeString(";
    goto LAB_002df94c;
  case (t_base_type *)0x2:
    pcVar7 = "writeBool(";
    goto LAB_002df930;
  case (t_base_type *)0x3:
    pcVar7 = "writeByte(";
LAB_002df930:
    lVar6 = 10;
    goto LAB_002df951;
  case (t_base_type *)0x4:
    pcVar7 = "writeI16(";
    break;
  case (t_base_type *)0x5:
    pcVar7 = "writeI32(";
    break;
  case (t_base_type *)0x6:
    pcVar7 = "writeI64(";
    break;
  case (t_base_type *)0x7:
    pcVar7 = "out.writeDouble(";
LAB_002df94c:
    pcVar7 = pcVar7 + 4;
    lVar6 = 0xc;
    goto LAB_002df951;
  default:
    auVar9 = __cxa_allocate_exception(0x20);
    t_base_type::t_base_name_abi_cxx11_(&local_e0,this_00,auVar9._8_4_);
    std::operator+(auVar9._0_8_,"compiler error: no ocaml name for base type ",&local_e0);
    __cxa_throw(auVar9._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  lVar6 = 9;
LAB_002df951:
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar7,lVar6);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
LAB_002df6db:
  std::__ostream_insert<char,std::char_traits<char>>(out,";",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_ocaml_generator::generate_serialize_field(ostream& out, t_field* tfield, string name) {
  t_type* type = get_true_type(tfield->get_type());

  // Do nothing for void types
  if (type->is_void()) {
    throw "CANNOT GENERATE SERIALIZE CODE FOR void TYPE: " + tfield->get_name();
  }

  if (name.length() == 0) {
    name = decapitalize(tfield->get_name());
  }

  if (type->is_struct() || type->is_xception()) {
    generate_serialize_struct(out, (t_struct*)type, name);
  } else if (type->is_container()) {
    generate_serialize_container(out, type, name);
  } else if (type->is_base_type() || type->is_enum()) {

    indent(out) << "oprot#";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot serialize void field in a struct: " + name;
        break;
      case t_base_type::TYPE_STRING:
        out << "writeString(" << name << ")";
        break;
      case t_base_type::TYPE_BOOL:
        out << "writeBool(" << name << ")";
        break;
      case t_base_type::TYPE_I8:
        out << "writeByte(" << name << ")";
        break;
      case t_base_type::TYPE_I16:
        out << "writeI16(" << name << ")";
        break;
      case t_base_type::TYPE_I32:
        out << "writeI32(" << name << ")";
        break;
      case t_base_type::TYPE_I64:
        out << "writeI64(" << name << ")";
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "writeDouble(" << name << ")";
        break;
      default:
        throw "compiler error: no ocaml name for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      string ename = capitalize(type->get_name());
      out << "writeI32(" << ename << ".to_i " << name << ")";
    }

  } else {
    printf("DO NOT KNOW HOW TO SERIALIZE FIELD '%s' TYPE '%s'\n",
           tfield->get_name().c_str(),
           type->get_name().c_str());
  }
  out << ";" << endl;
}